

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

TupleExtract * __thiscall MixedArena::alloc<wasm::TupleExtract>(MixedArena *this)

{
  TupleExtract *pTVar1;
  
  pTVar1 = (TupleExtract *)allocSpace(this,0x20,8);
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id = TupleExtractId
  ;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id = 0;
  return pTVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }